

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

void __thiscall ON_3dPoint::ON_3dPoint(ON_3dPoint *this,ON_4dPoint *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = p->x;
  this->x = dVar1;
  dVar2 = p->y;
  this->y = dVar2;
  dVar3 = p->z;
  this->z = dVar3;
  dVar4 = p->w;
  dVar4 = (double)(~-(ulong)(dVar4 != 1.0) & 0x3ff0000000000000 |
                  (~-(ulong)(dVar4 != 0.0) & 0x3ff0000000000000 |
                  (ulong)(1.0 / dVar4) & -(ulong)(dVar4 != 0.0)) & -(ulong)(dVar4 != 1.0));
  this->x = dVar1 * dVar4;
  this->y = dVar2 * dVar4;
  this->z = dVar4 * dVar3;
  return;
}

Assistant:

ON_3dPoint::ON_3dPoint(const ON_4dPoint& p)
{
  x=p.x;y=p.y;z=p.z;
  const double w = (p.w != 1.0 && p.w != 0.0) ? 1.0/p.w : 1.0;
  x *= w;
  y *= w;
  z *= w;
}